

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v256_intrinsics_c.h
# Opt level: O2

c_v256 * c_v256_sadd_u8(c_v256 a,c_v256 b)

{
  c_v256 *in_RDI;
  c_v128 cVar1;
  c_v128 cVar2;
  undefined1 in_stack_00000008 [16];
  undefined8 in_stack_00000018;
  
  cVar1.u64[1] = a.u64[0];
  cVar1.u64[0] = in_stack_00000018;
  cVar2.u64[1] = b.u64[0];
  cVar2.u64[0] = a.u64[3];
  cVar1 = c_v128_sadd_u8(cVar1,cVar2);
  cVar2 = c_v128_sadd_u8((c_v128)in_stack_00000008,(c_v128)a._8_16_);
  in_RDI->v128[1] = cVar1;
  in_RDI->v128[0] = cVar2;
  return in_RDI;
}

Assistant:

SIMD_INLINE c_v256 c_v256_sadd_u8(c_v256 a, c_v256 b) {
  return c_v256_from_v128(c_v128_sadd_u8(a.v128[1], b.v128[1]),
                          c_v128_sadd_u8(a.v128[0], b.v128[0]));
}